

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.c
# Opt level: O2

char * readline(char *source,int *pointer)

{
  char cVar1;
  int iVar2;
  void *__ptr;
  char *pcVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  
  iVar2 = *pointer;
  __ptr = (void *)0x0;
  uVar4 = 0;
  uVar6 = (long)iVar2;
  do {
    iVar5 = (int)uVar6;
    cVar1 = source[uVar4 + (long)iVar2];
    if (cVar1 == '\n') {
LAB_00106a13:
      *pointer = iVar5 + 1;
      pcVar3 = (char *)realloc(__ptr,(ulong)((int)uVar4 + 2));
      (pcVar3 + (uVar4 & 0xffffffff))[0] = '\n';
      (pcVar3 + (uVar4 & 0xffffffff))[1] = '\0';
      return pcVar3;
    }
    if (cVar1 == '\r') {
      iVar5 = iVar5 + 1;
      goto LAB_00106a13;
    }
    __ptr = realloc(__ptr,uVar4 + 1);
    *(char *)((long)__ptr + uVar4) = cVar1;
    uVar6 = (ulong)(iVar5 + 1U);
    *pointer = iVar5 + 1U;
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

static char* readline(const char *source, int *pointer){
    char *line = NULL;
    int i = 0;
    while(!(source[*pointer] == '\r' || source[*pointer] == '\n')){
        i++;
        line = (char *)reallocate(line, sizeof(char) * i);
        line[i - 1] = source[*pointer];
        *pointer = *pointer + 1;
    }
    if(source[*pointer] == '\r')
        *pointer = *pointer + 1;
    *pointer = *pointer + 1;
    
    i += 2;
    line = (char *)reallocate(line, sizeof(char) * i);
    line[i - 1] = '\0';
    line[i - 2] = '\n';

    return line;
}